

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_field.h
# Opt level: O2

void __thiscall
google::protobuf::internal::RepeatedPtrFieldBase::
MergeFrom<google::protobuf::RepeatedPtrField<google::protobuf::FileDescriptorProto>::TypeHandler>
          (RepeatedPtrFieldBase *this,RepeatedPtrFieldBase *other)

{
  LogMessage *pLVar1;
  LogMessage local_60 [63];
  LogFinisher local_21;
  
  if (other == this) {
    google::protobuf::internal::LogMessage::LogMessage
              (local_60,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/LLNL[P]wcs/build_O2/src/src/google/protobuf/repeated_field.h"
               ,0x6fb);
    pLVar1 = (LogMessage *)
             google::protobuf::internal::LogMessage::operator<<
                       (local_60,"CHECK failed: (&other) != (this): ");
    google::protobuf::internal::LogFinisher::operator=(&local_21,pLVar1);
    google::protobuf::internal::LogMessage::~LogMessage(local_60);
  }
  if (other->current_size_ != 0) {
    MergeFromInternal(this,other,
                      (offset_in_RepeatedPtrFieldBase_to_subr)
                      MergeFromInnerLoop<google::protobuf::RepeatedPtrField<google::protobuf::FileDescriptorProto>::TypeHandler>
                     );
  }
  return;
}

Assistant:

inline void RepeatedPtrFieldBase::MergeFrom(const RepeatedPtrFieldBase& other) {
  GOOGLE_DCHECK_NE(&other, this);
  if (other.current_size_ == 0) return;
  MergeFromInternal(other,
                    &RepeatedPtrFieldBase::MergeFromInnerLoop<TypeHandler>);
}